

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmapfile.cpp
# Opt level: O2

void __thiscall MemoryMappedFile::MemoryMappedFile(MemoryMappedFile *this,char *path)

{
  int __fd;
  int iVar1;
  void *pvVar2;
  stat fileSt;
  
  this->file = 0;
  this->baseAddress = (void *)0x0;
  this->fileSize = 0;
  __fd = open(path,0);
  if (__fd != -1) {
    iVar1 = fstat(__fd,(stat *)&fileSt);
    if ((iVar1 != -1) &&
       (pvVar2 = mmap((void *)0x0,fileSt.st_size,1,2,__fd,0), pvVar2 != (void *)0xffffffffffffffff))
    {
      this->file = __fd;
      this->baseAddress = pvVar2;
      this->fileSize = fileSt.st_size;
      return;
    }
    close(__fd);
  }
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(const char* path)
{
#ifdef _WIN32
	void* file = CreateFileA(path, GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_READONLY, nullptr);
	if (file == INVALID_HANDLE_VALUE)
		return;

	LARGE_INTEGER fileSize = {};
	GetFileSizeEx(file, &fileSize);

	void* fileMapping = CreateFileMappingW(file, nullptr, PAGE_READONLY, 0, 0, nullptr);
	if (fileMapping == nullptr)
	{
		CloseHandle(file);
		return;
	}

	void* baseAddress = MapViewOfFile(fileMapping, FILE_MAP_READ, 0, 0, 0);
	if (baseAddress == nullptr)
	{
		CloseHandle(fileMapping);
		CloseHandle(file);
		return;
	}

	this->file = file;
	this->mapping = fileMapping;
	this->baseAddress = baseAddress;
	this->fileSize = fileSize.QuadPart;
#else
    int file = open(path, O_RDONLY);
    if (file == -1)
        return;
    struct stat fileSt;
    if (fstat(file, &fileSt) == -1)
    {
        close(file);
        return;
    }
    void* baseAddress = mmap(nullptr, fileSt.st_size, PROT_READ, MAP_PRIVATE, file, 0);
    if (baseAddress == MAP_FAILED)
    {
        close(file);
        return;
    }
    this->file = file;
    this->baseAddress = baseAddress;
    this->fileSize = fileSt.st_size;
#endif
}